

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O2

bool test_uintwide_t_edge::test_various_ostream_ops(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  __type _Var3;
  __type _Var4;
  __type _Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  unsigned_long uVar9;
  ostream *poVar10;
  reference pvVar11;
  int in_R8D;
  int iVar12;
  string str_ctrl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  local_uintwide_t_small_unsigned_type u;
  stringstream strm;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  uVar9 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
          *)eng_sgn,uVar9);
  uVar9 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
          *)eng_dig,uVar9);
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (&u,0x72b3,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  std::__cxx11::stringstream::stringstream((stringstream *)&strm);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
  puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar2 = *puVar2 | 0x200;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 100;
  poVar10 = std::operator<<(local_1a8,0x23);
  math::wide_integer::operator<<(poVar10,&u);
  paVar1 = &str_ctrl.field_2;
  str_ctrl._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&str_ctrl,100,'#');
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 5);
  *pvVar11 = '2';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 4);
  *pvVar11 = '9';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 3);
  *pvVar11 = '3';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 2);
  *pvVar11 = '6';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 1);
  *pvVar11 = '3';
  std::__cxx11::stringbuf::str();
  _Var3 = std::operator==(&local_1f8,&str_ctrl);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&str_ctrl);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (&u,0xa2f7,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  std::__cxx11::stringstream::stringstream((stringstream *)&strm);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar2 = *puVar2 | 0x4000;
  puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar2 = *puVar2 | 0x200;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 100;
  poVar10 = std::operator<<(local_1a8,0x23);
  math::wide_integer::operator<<(poVar10,&u);
  str_ctrl._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&str_ctrl,100,'#');
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 6);
  *pvVar11 = '0';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 5);
  *pvVar11 = 'X';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 4);
  *pvVar11 = 'A';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 3);
  *pvVar11 = '2';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 2);
  *pvVar11 = 'F';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 1);
  *pvVar11 = '7';
  std::__cxx11::stringbuf::str();
  _Var4 = std::operator==(&local_1f8,&str_ctrl);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&str_ctrl);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (&u,0x72b3,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  std::__cxx11::stringstream::stringstream((stringstream *)&strm);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 0x40;
  puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar2 = *puVar2 | 0x4000;
  puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar2 = *puVar2 | 0x200;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 100;
  poVar10 = std::operator<<(local_1a8,0x23);
  math::wide_integer::operator<<(poVar10,&u);
  str_ctrl._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&str_ctrl,100,'#');
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 6);
  *pvVar11 = '0';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 5);
  *pvVar11 = '7';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 4);
  *pvVar11 = '1';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 3);
  *pvVar11 = '2';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 2);
  *pvVar11 = '6';
  pvVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                      (&str_ctrl,str_ctrl._M_string_length - 1);
  *pvVar11 = '3';
  std::__cxx11::stringbuf::str();
  _Var5 = std::operator==(&local_1f8,&str_ctrl);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&str_ctrl);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (&u,0,(enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
                   *)0x0);
  std::__cxx11::stringstream::stringstream((stringstream *)&strm);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 0x40;
  math::wide_integer::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&u);
  std::__cxx11::stringbuf::str();
  bVar6 = std::operator==(&str_ctrl,"0");
  std::__cxx11::string::~string((string *)&str_ctrl);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  std::__cxx11::stringstream::stringstream((stringstream *)&strm);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
  math::wide_integer::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&u);
  std::__cxx11::stringbuf::str();
  bVar7 = std::operator==(&str_ctrl,"0");
  std::__cxx11::string::~string((string *)&str_ctrl);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  std::__cxx11::stringstream::stringstream((stringstream *)&strm);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  math::wide_integer::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&u);
  std::__cxx11::stringbuf::str();
  bVar8 = std::operator==(&str_ctrl,"0");
  std::__cxx11::string::~string((string *)&str_ctrl);
  bVar8 = bVar8 && ((((_Var3 && _Var4) && _Var5) && bVar6) && bVar7);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  iVar12 = 0x400;
  while (bVar6 = iVar12 != 0, iVar12 = iVar12 + -1, bVar6) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              (&u,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    std::__cxx11::stringstream::stringstream((stringstream *)&strm);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
    math::wide_integer::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&u);
    std::__cxx11::stringbuf::str();
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&str_ctrl,local_1f8._M_dataplus._M_p
              );
    std::__cxx11::string::~string((string *)&local_1f8);
    bVar6 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      (&u,(uintwide_t<256U,_unsigned_short,_void,_false> *)&str_ctrl);
    bVar8 = (bool)(bVar8 & bVar6);
    std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  }
  iVar12 = 0x400;
  while (bVar6 = iVar12 != 0, iVar12 = iVar12 + -1, bVar6) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              (&u,(test_uintwide_t_edge *)0x1,true,0x40,in_R8D);
    std::__cxx11::stringstream::stringstream((stringstream *)&strm);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar2 = *puVar2 | 0x200;
    math::wide_integer::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&u);
    std::__cxx11::stringbuf::str();
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&str_ctrl,local_1f8._M_dataplus._M_p
              );
    std::__cxx11::string::~string((string *)&local_1f8);
    bVar6 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      (&u,(uintwide_t<256U,_unsigned_short,_void,_false> *)&str_ctrl);
    bVar8 = (bool)(bVar8 & bVar6);
    std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  }
  iVar12 = 0x400;
  while (bVar6 = iVar12 != 0, iVar12 = iVar12 + -1, bVar6) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              (&u,(test_uintwide_t_edge *)0x1,true,0x55,in_R8D);
    std::__cxx11::stringstream::stringstream((stringstream *)&strm);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 0x40;
    puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar2 = *puVar2 | 0x200;
    math::wide_integer::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&u);
    std::__cxx11::stringbuf::str();
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&str_ctrl,local_1f8._M_dataplus._M_p
              );
    std::__cxx11::string::~string((string *)&local_1f8);
    bVar6 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      (&u,(uintwide_t<256U,_unsigned_short,_void,_false> *)&str_ctrl);
    bVar8 = (bool)(bVar8 & bVar6);
    std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  }
  iVar12 = 0x400;
  while (bVar6 = iVar12 != 0, iVar12 = iVar12 + -1, bVar6) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)&u,(test_uintwide_t_edge *)0x0,false,
               0x4c,in_R8D);
    std::__cxx11::stringstream::stringstream((stringstream *)&strm);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
    puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar2 = *puVar2 | 0x800;
    math::wide_integer::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
               (uintwide_t<256U,_unsigned_short,_void,_true> *)&u);
    std::__cxx11::stringbuf::str();
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)&str_ctrl,local_1f8._M_dataplus._M_p)
    ;
    std::__cxx11::string::~string((string *)&local_1f8);
    bVar6 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_true> *)&u,
                       (uintwide_t<256U,_unsigned_short,_void,_true> *)&str_ctrl);
    bVar8 = (bool)(bVar8 & bVar6);
    std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  }
  iVar12 = 0x400;
  while (bVar6 = iVar12 != 0, iVar12 = iVar12 + -1, bVar6) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)&u,(test_uintwide_t_edge *)0x0,true,
               0x40,in_R8D);
    std::__cxx11::stringstream::stringstream((stringstream *)&strm);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar2 = *puVar2 | 0x200;
    puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar2 = *puVar2 | 0x800;
    math::wide_integer::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
               (uintwide_t<256U,_unsigned_short,_void,_true> *)&u);
    std::__cxx11::stringbuf::str();
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)&str_ctrl,local_1f8._M_dataplus._M_p)
    ;
    std::__cxx11::string::~string((string *)&local_1f8);
    bVar6 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_true> *)&u,
                       (uintwide_t<256U,_unsigned_short,_void,_true> *)&str_ctrl);
    bVar8 = (bool)(bVar8 & bVar6);
    std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  }
  iVar12 = 0x400;
  while (bVar6 = iVar12 != 0, iVar12 = iVar12 + -1, bVar6) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)&u,(test_uintwide_t_edge *)0x0,true,
               0x55,in_R8D);
    std::__cxx11::stringstream::stringstream((stringstream *)&strm);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 0x40;
    puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar2 = *puVar2 | 0x200;
    puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar2 = *puVar2 | 0x800;
    math::wide_integer::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
               (uintwide_t<256U,_unsigned_short,_void,_true> *)&u);
    std::__cxx11::stringbuf::str();
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)&str_ctrl,local_1f8._M_dataplus._M_p)
    ;
    std::__cxx11::string::~string((string *)&local_1f8);
    bVar6 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_true> *)&u,
                       (uintwide_t<256U,_unsigned_short,_void,_true> *)&str_ctrl);
    bVar8 = (bool)(bVar8 & bVar6);
    std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  }
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t(&u,"-0x1");
  std::__cxx11::stringstream::stringstream((stringstream *)&strm);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  math::wide_integer::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&u);
  std::__cxx11::stringbuf::str();
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)&str_ctrl,local_1f8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1f8);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::limits_helper_max<false>();
  bVar6 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&str_ctrl,
                     (uintwide_t<256U,_unsigned_short,_void,_false> *)&local_1f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm);
  return (bool)(bVar6 & bVar8);
}

Assistant:

auto test_various_ostream_ops() -> bool
{
  auto result_is_ok = true;

  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(29363)));

    std::stringstream strm;

    strm << std::dec << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = '9';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '3';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = '6';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '3';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(41719)));

    std::stringstream strm;

    strm << std::hex << std::uppercase << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(5)))) = '0';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = 'X';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = 'A';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = 'F';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '7';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(29363)));

    std::stringstream strm;

    strm << std::oct << std::uppercase << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(5)))) = '0';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = '7';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = '1';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = '6';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '3';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto z = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT8_C(0)));

    {
      std::stringstream strm;

      strm << std::oct << z;

      const auto result_zero_print_as_oct_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_oct_is_ok && result_is_ok);
    }

    {
      std::stringstream strm;

      strm << std::dec << z;

      const auto result_zero_print_as_dec_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_dec_is_ok && result_is_ok);
    }

    {
      std::stringstream strm;

      strm << std::hex << z;

      const auto result_zero_print_as_hex_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_hex_is_ok && result_is_ok);
    }
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::dec,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits10
      );

    std::stringstream strm;

    strm << std::dec << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::hex,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / 4
      );

    std::stringstream strm;

    strm << std::hex << std::showbase << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::oct,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / 3
      );

    std::stringstream strm;

    strm << std::oct << std::showbase << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::dec,
        std::numeric_limits<local_uintwide_t_small_signed_type>::digits10
      );

    std::stringstream strm;

    strm << std::dec << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::hex,
        (std::numeric_limits<local_uintwide_t_small_signed_type>::digits + 1) / 4
      );

    std::stringstream strm;

    strm << std::hex << std::showbase << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::oct,
        (std::numeric_limits<local_uintwide_t_small_signed_type>::digits + 1) / 3
      );

    std::stringstream strm;

    strm << std::oct << std::showbase << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  {
    const local_uintwide_t_small_unsigned_type m1("-0x1");

    std::stringstream strm;

    strm << std::hex << m1;

    const local_uintwide_t_small_unsigned_type m1_from_strm(strm.str().c_str());

    const auto result_read_and_round_trip_neg_hex_str_is_ok =
    (
      m1_from_strm == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)()
    );

    result_is_ok = (result_read_and_round_trip_neg_hex_str_is_ok && result_is_ok);
  }

  return result_is_ok;
}